

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

real __thiscall
fasttext::ProductQuantizer::mulcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  float *pfVar5;
  ulong uVar6;
  int iVar7;
  float fVar8;
  
  iVar1 = this->nsubq_;
  if ((long)iVar1 < 1) {
    fVar8 = 0.0;
  }
  else {
    uVar2 = this->dsub_;
    pfVar5 = (x->data_).mem_;
    fVar8 = 0.0;
    uVar3 = 0;
    uVar4 = uVar2;
    do {
      iVar7 = (int)uVar3 * this->ksub_;
      if (uVar3 == iVar1 - 1) {
        iVar7 = iVar7 * uVar2 + (uint)codes[uVar3 + (long)(t * iVar1)] * this->lastdsub_;
        uVar4 = this->lastdsub_;
      }
      else {
        iVar7 = (iVar7 + (uint)codes[uVar3 + (long)(t * iVar1)]) * uVar2;
      }
      if (0 < (int)uVar4) {
        uVar6 = 0;
        do {
          fVar8 = fVar8 + pfVar5[uVar6] *
                          (this->centroids_).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start[(long)iVar7 + uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      uVar3 = uVar3 + 1;
      pfVar5 = pfVar5 + (int)uVar2;
    } while (uVar3 != (long)iVar1);
  }
  return fVar8 * alpha;
}

Assistant:

real ProductQuantizer::mulcode(
    const Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  real res = 0.0;
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      res += x[m * dsub_ + n] * c[n];
    }
  }
  return res * alpha;
}